

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-bst.c
# Opt level: O0

pboolean p_tree_bst_remove(PTreeBaseNode **root_node,PCompareDataFunc compare_func,ppointer data,
                          PDestroyFunc key_destroy_func,PDestroyFunc value_destroy_func,
                          pconstpointer key)

{
  pint pVar1;
  PTreeBaseNode *local_68;
  PTreeBaseNode *pPStack_58;
  pint cmp_result;
  PTreeBaseNode **node_pointer;
  PTreeBaseNode *prev_node;
  PTreeBaseNode *cur_node;
  pconstpointer key_local;
  PDestroyFunc value_destroy_func_local;
  PDestroyFunc key_destroy_func_local;
  ppointer data_local;
  PCompareDataFunc compare_func_local;
  PTreeBaseNode **root_node_local;
  
  prev_node = *root_node;
  pPStack_58 = (PTreeBaseNode *)root_node;
  while (prev_node != (PTreeBaseNode *)0x0) {
    pVar1 = (*compare_func)(key,prev_node->key,data);
    if (pVar1 < 0) {
      pPStack_58 = prev_node;
      prev_node = prev_node->left;
    }
    else {
      if (pVar1 < 1) break;
      pPStack_58 = (PTreeBaseNode *)&prev_node->right;
      prev_node = prev_node->right;
    }
  }
  if (prev_node == (PTreeBaseNode *)0x0) {
    root_node_local._4_4_ = 0;
  }
  else {
    if ((prev_node->left != (PTreeBaseNode_ *)0x0) && (prev_node->right != (PTreeBaseNode_ *)0x0)) {
      pPStack_58 = prev_node;
      for (node_pointer = &prev_node->left->left; node_pointer[1] != (PTreeBaseNode *)0x0;
          node_pointer = &node_pointer[1]->left) {
        pPStack_58 = (PTreeBaseNode *)(node_pointer + 1);
      }
      prev_node->key = node_pointer[2];
      prev_node->value = node_pointer[3];
      prev_node = (PTreeBaseNode *)node_pointer;
    }
    if (prev_node->left == (PTreeBaseNode_ *)0x0) {
      local_68 = prev_node->right;
    }
    else {
      local_68 = prev_node->left;
    }
    pPStack_58->left = local_68;
    if (key_destroy_func != (PDestroyFunc)0x0) {
      (*key_destroy_func)(prev_node->key);
    }
    if (value_destroy_func != (PDestroyFunc)0x0) {
      (*value_destroy_func)(prev_node->value);
    }
    p_free(prev_node);
    root_node_local._4_4_ = 1;
  }
  return root_node_local._4_4_;
}

Assistant:

pboolean
p_tree_bst_remove (PTreeBaseNode	**root_node,
		   PCompareDataFunc	compare_func,
		   ppointer		data,
		   PDestroyFunc		key_destroy_func,
		   PDestroyFunc		value_destroy_func,
		   pconstpointer	key)
{
	PTreeBaseNode	*cur_node;
	PTreeBaseNode	*prev_node;
	PTreeBaseNode	**node_pointer;
	pint		cmp_result;

	cur_node     = *root_node;
	node_pointer = root_node;

	while (cur_node != NULL) {
		cmp_result = compare_func (key, cur_node->key, data);

		if (cmp_result < 0) {
			node_pointer = &cur_node->left;
			cur_node     = cur_node->left;
		} else if (cmp_result > 0) {
			node_pointer = &cur_node->right;
			cur_node     = cur_node->right;
		} else
			break;
	}

	if (P_UNLIKELY (cur_node == NULL))
		return FALSE;

	if (cur_node->left != NULL && cur_node->right != NULL) {
		node_pointer = &cur_node->left;
		prev_node    = cur_node->left;

		while (prev_node->right != NULL) {
			node_pointer = &prev_node->right;
			prev_node    = prev_node->right;
		}

		cur_node->key   = prev_node->key;
		cur_node->value = prev_node->value;

		cur_node = prev_node;
	}

	*node_pointer = cur_node->left == NULL ? cur_node->right : cur_node->left;

	if (key_destroy_func != NULL)
		key_destroy_func (cur_node->key);

	if (value_destroy_func != NULL)
		value_destroy_func (cur_node->value);

	p_free (cur_node);

	return TRUE;
}